

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::calculateProblemRanges
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  undefined8 *puVar1;
  uint *puVar2;
  pointer pnVar3;
  cpp_dec_float<50U,_int,_void> *pcVar4;
  undefined1 auVar5 [16];
  int iVar6;
  double *pdVar7;
  fpclass_type fVar8;
  long lVar9;
  long lVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxside;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxbound;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minside;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minbound;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxobj;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minobj;
  cpp_dec_float<50U,_int,_void> local_2e8;
  cpp_dec_float<50U,_int,_void> local_2a8;
  double local_270;
  cpp_dec_float<50U,_int,_void> local_268;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  undefined1 local_a8 [16];
  uint local_98 [3];
  undefined3 uStack_8b;
  uint uStack_88;
  undefined8 uStack_83;
  undefined8 local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  ::soplex::infinity::__tls_init();
  pdVar7 = (double *)__tls_get_addr(&PTR_003b4b70);
  local_270 = *pdVar7;
  local_e8.fpclass = cpp_dec_float_finite;
  local_e8.prec_elem = 10;
  local_e8.data._M_elems[0] = 0;
  local_e8.data._M_elems[1] = 0;
  local_e8.data._M_elems[2] = 0;
  local_e8.data._M_elems[3] = 0;
  local_e8.data._M_elems[4] = 0;
  local_e8.data._M_elems[5] = 0;
  local_e8.data._M_elems._24_5_ = 0;
  local_e8.data._M_elems[7]._1_3_ = 0;
  local_e8.data._M_elems._32_5_ = 0;
  local_e8.data._M_elems[9]._1_3_ = 0;
  local_e8.exp = 0;
  local_e8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_e8,local_270);
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems._24_5_ = 0;
  local_128.data._M_elems[7]._1_3_ = 0;
  local_128.data._M_elems._32_5_ = 0;
  local_128.data._M_elems[9]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_128,0.0);
  ::soplex::infinity::__tls_init();
  local_168.fpclass = cpp_dec_float_finite;
  local_168.prec_elem = 10;
  local_168.data._M_elems[0] = 0;
  local_168.data._M_elems[1] = 0;
  local_168.data._M_elems[2] = 0;
  local_168.data._M_elems[3] = 0;
  local_168.data._M_elems[4] = 0;
  local_168.data._M_elems[5] = 0;
  local_168.data._M_elems._24_5_ = 0;
  local_168.data._M_elems[7]._1_3_ = 0;
  local_168.data._M_elems._32_5_ = 0;
  local_168.data._M_elems[9]._1_3_ = 0;
  local_168.exp = 0;
  local_168.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_168,local_270);
  local_1e8.fpclass = cpp_dec_float_finite;
  local_1e8.prec_elem = 10;
  local_1e8.data._M_elems[0] = 0;
  local_1e8.data._M_elems[1] = 0;
  local_1e8.data._M_elems[2] = 0;
  local_1e8.data._M_elems[3] = 0;
  local_1e8.data._M_elems[4] = 0;
  local_1e8.data._M_elems[5] = 0;
  local_1e8.data._M_elems._24_5_ = 0;
  local_1e8.data._M_elems[7]._1_3_ = 0;
  local_1e8.data._M_elems._32_5_ = 0;
  local_1e8.data._M_elems[9]._1_3_ = 0;
  local_1e8.exp = 0;
  local_1e8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_1e8,0.0);
  ::soplex::infinity::__tls_init();
  local_1a8.fpclass = cpp_dec_float_finite;
  local_1a8.prec_elem = 10;
  local_1a8.data._M_elems[0] = 0;
  local_1a8.data._M_elems[1] = 0;
  local_1a8.data._M_elems[2] = 0;
  local_1a8.data._M_elems[3] = 0;
  local_1a8.data._M_elems[4] = 0;
  local_1a8.data._M_elems[5] = 0;
  local_1a8.data._M_elems._24_5_ = 0;
  local_1a8.data._M_elems[7]._1_3_ = 0;
  local_1a8.data._M_elems._32_5_ = 0;
  local_1a8.data._M_elems[9]._1_3_ = 0;
  local_1a8.exp = 0;
  local_1a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_1a8,local_270);
  local_228.fpclass = cpp_dec_float_finite;
  local_228.prec_elem = 10;
  local_228.data._M_elems[0] = 0;
  local_228.data._M_elems[1] = 0;
  local_228.data._M_elems[2] = 0;
  local_228.data._M_elems[3] = 0;
  local_228.data._M_elems[4] = 0;
  local_228.data._M_elems[5] = 0;
  local_228.data._M_elems._24_5_ = 0;
  local_228.data._M_elems[7]._1_3_ = 0;
  local_228.data._M_elems._32_5_ = 0;
  local_228.data._M_elems[9]._1_3_ = 0;
  local_228.exp = 0;
  local_228.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_228,0.0);
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar10 = 0x30;
    lVar9 = 0;
    do {
      pnVar3 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_2e8.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar10 + -8);
      local_2e8.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar10 + -4);
      local_2e8._48_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar10);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar10 + -0x30);
      local_2e8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_2e8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar10 + -0x20);
      local_2e8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_2e8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_2e8.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar10 + -0x10);
      if ((local_2e8.neg == true) &&
         (local_2e8.fpclass != cpp_dec_float_finite || local_2e8.data._M_elems[0] != 0)) {
        local_2e8.neg = false;
      }
      puVar1 = (undefined8 *)((long)&(pnVar3->m_backend).data + lVar10);
      local_2a8.exp = *(int *)(puVar1 + -1);
      local_2a8.neg = *(bool *)((long)puVar1 + -4);
      local_2a8._48_8_ = *puVar1;
      local_2a8.data._M_elems._0_8_ = puVar1[-6];
      local_2a8.data._M_elems._8_8_ = puVar1[-5];
      local_2a8.data._M_elems._16_8_ = puVar1[-4];
      local_2a8.data._M_elems._24_8_ = puVar1[-3];
      local_2a8.data._M_elems._32_8_ = puVar1[-2];
      if ((local_2a8.neg == true) &&
         (local_2a8.fpclass != cpp_dec_float_finite || local_2a8.data._M_elems[0] != 0)) {
        local_2a8.neg = false;
      }
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::obj(&local_68,
            &this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ,(int)lVar9);
      local_268.data._M_elems._32_5_ = local_68.m_backend.data._M_elems._32_5_;
      local_268.data._M_elems[9]._1_3_ = local_68.m_backend.data._M_elems[9]._1_3_;
      local_268.data._M_elems[4] = local_68.m_backend.data._M_elems[4];
      local_268.data._M_elems[5] = local_68.m_backend.data._M_elems[5];
      local_268.data._M_elems._24_5_ = local_68.m_backend.data._M_elems._24_5_;
      local_268.data._M_elems[7]._1_3_ = local_68.m_backend.data._M_elems[7]._1_3_;
      local_268.data._M_elems[2] = local_68.m_backend.data._M_elems[2];
      local_268.data._M_elems[3] = local_68.m_backend.data._M_elems[3];
      local_268.data._M_elems[0] = local_68.m_backend.data._M_elems[0];
      local_268.data._M_elems[1] = local_68.m_backend.data._M_elems[1];
      auVar5 = (undefined1  [16])local_268.data._M_elems._0_16_;
      local_268.exp = local_68.m_backend.exp;
      local_268.neg = local_68.m_backend.neg;
      local_268.fpclass = local_68.m_backend.fpclass;
      local_268.prec_elem = local_68.m_backend.prec_elem;
      if ((local_68.m_backend.neg == true) &&
         (local_268.data._M_elems[0] = local_68.m_backend.data._M_elems[0],
         local_68.m_backend.fpclass != cpp_dec_float_finite || local_268.data._M_elems[0] != 0)) {
        local_268.neg = false;
      }
      local_268.data._M_elems._0_16_ = auVar5;
      ::soplex::infinity::__tls_init();
      local_78._0_4_ = cpp_dec_float_finite;
      local_78._4_4_ = 10;
      local_a8 = (undefined1  [16])0x0;
      local_98[0] = 0;
      local_98[1] = 0;
      stack0xffffffffffffff70 = 0;
      uStack_8b = 0;
      _uStack_88 = 0;
      uStack_83 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_a8,local_270);
      if (((local_2e8.fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_78 != cpp_dec_float_NaN)
          ) && (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_2e8,(cpp_dec_float<50U,_int,_void> *)local_a8), iVar6 < 0)
         ) {
        if (local_2e8.fpclass == cpp_dec_float_NaN || local_168.fpclass == cpp_dec_float_NaN) {
LAB_00284ef8:
          local_168.data._M_elems._32_5_ = local_2e8.data._M_elems._32_5_;
          local_168.data._M_elems[9]._1_3_ = local_2e8.data._M_elems[9]._1_3_;
          local_168.data._M_elems[4] = local_2e8.data._M_elems[4];
          local_168.data._M_elems[5] = local_2e8.data._M_elems[5];
          local_168.data._M_elems._24_5_ = local_2e8.data._M_elems._24_5_;
          local_168.data._M_elems[7]._1_3_ = local_2e8.data._M_elems[7]._1_3_;
          local_168.data._M_elems[0] = local_2e8.data._M_elems[0];
          local_168.data._M_elems[1] = local_2e8.data._M_elems[1];
          local_168.data._M_elems[2] = local_2e8.data._M_elems[2];
          local_168.data._M_elems[3] = local_2e8.data._M_elems[3];
          local_168.exp = local_2e8.exp;
          local_168.neg = local_2e8.neg;
          local_168.fpclass = local_2e8.fpclass;
          pcVar4 = &local_2e8;
          fVar8 = local_2e8.fpclass;
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_168,&local_2e8);
          pcVar4 = &local_168;
          fVar8 = local_2e8.fpclass;
          if (-1 < iVar6) goto LAB_00284ef8;
        }
        local_168.prec_elem = pcVar4->prec_elem;
        if ((local_1e8.fpclass == cpp_dec_float_NaN) || (fVar8 == cpp_dec_float_NaN)) {
LAB_00284f78:
          local_1e8.data._M_elems._32_5_ = local_2e8.data._M_elems._32_5_;
          local_1e8.data._M_elems[9]._1_3_ = local_2e8.data._M_elems[9]._1_3_;
          local_1e8.data._M_elems[4] = local_2e8.data._M_elems[4];
          local_1e8.data._M_elems[5] = local_2e8.data._M_elems[5];
          local_1e8.data._M_elems._24_5_ = local_2e8.data._M_elems._24_5_;
          local_1e8.data._M_elems[7]._1_3_ = local_2e8.data._M_elems[7]._1_3_;
          local_1e8.data._M_elems[0] = local_2e8.data._M_elems[0];
          local_1e8.data._M_elems[1] = local_2e8.data._M_elems[1];
          local_1e8.data._M_elems[2] = local_2e8.data._M_elems[2];
          local_1e8.data._M_elems[3] = local_2e8.data._M_elems[3];
          local_1e8.exp = local_2e8.exp;
          local_1e8.neg = local_2e8.neg;
          local_1e8.fpclass = fVar8;
          pcVar4 = &local_2e8;
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1e8,&local_2e8);
          pcVar4 = &local_1e8;
          if (iVar6 < 1) {
            fVar8 = local_2e8.fpclass;
            goto LAB_00284f78;
          }
        }
        local_1e8.prec_elem = pcVar4->prec_elem;
      }
      ::soplex::infinity::__tls_init();
      local_78._0_4_ = cpp_dec_float_finite;
      local_78._4_4_ = 10;
      local_a8 = ZEXT816(0);
      local_98[0] = 0;
      local_98[1] = 0;
      stack0xffffffffffffff70 = 0;
      uStack_8b = 0;
      _uStack_88 = 0;
      uStack_83 = 0;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_a8,local_270);
      if (((local_2a8.fpclass != cpp_dec_float_NaN) && ((fpclass_type)local_78 != cpp_dec_float_NaN)
          ) && (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_2a8,(cpp_dec_float<50U,_int,_void> *)local_a8), iVar6 < 0)
         ) {
        if (local_2a8.fpclass == cpp_dec_float_NaN || local_168.fpclass == cpp_dec_float_NaN) {
LAB_0028506d:
          local_168.data._M_elems._32_5_ = local_2a8.data._M_elems._32_5_;
          local_168.data._M_elems[9]._1_3_ = local_2a8.data._M_elems[9]._1_3_;
          local_168.data._M_elems[4] = local_2a8.data._M_elems[4];
          local_168.data._M_elems[5] = local_2a8.data._M_elems[5];
          local_168.data._M_elems._24_5_ = local_2a8.data._M_elems._24_5_;
          local_168.data._M_elems[7]._1_3_ = local_2a8.data._M_elems[7]._1_3_;
          local_168.data._M_elems[0] = local_2a8.data._M_elems[0];
          local_168.data._M_elems[1] = local_2a8.data._M_elems[1];
          local_168.data._M_elems[2] = local_2a8.data._M_elems[2];
          local_168.data._M_elems[3] = local_2a8.data._M_elems[3];
          local_168.exp = local_2a8.exp;
          local_168.neg = local_2a8.neg;
          local_168.fpclass = local_2a8.fpclass;
          pcVar4 = &local_2a8;
          fVar8 = local_2a8.fpclass;
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_168,&local_2a8);
          pcVar4 = &local_168;
          fVar8 = local_2a8.fpclass;
          if (-1 < iVar6) goto LAB_0028506d;
        }
        local_168.prec_elem = pcVar4->prec_elem;
        if ((local_1e8.fpclass == cpp_dec_float_NaN) || (fVar8 == cpp_dec_float_NaN)) {
LAB_002850f0:
          local_1e8.data._M_elems._32_5_ = local_2a8.data._M_elems._32_5_;
          local_1e8.data._M_elems[9]._1_3_ = local_2a8.data._M_elems[9]._1_3_;
          local_1e8.data._M_elems[4] = local_2a8.data._M_elems[4];
          local_1e8.data._M_elems[5] = local_2a8.data._M_elems[5];
          local_1e8.data._M_elems._24_5_ = local_2a8.data._M_elems._24_5_;
          local_1e8.data._M_elems[7]._1_3_ = local_2a8.data._M_elems[7]._1_3_;
          local_1e8.data._M_elems[0] = local_2a8.data._M_elems[0];
          local_1e8.data._M_elems[1] = local_2a8.data._M_elems[1];
          local_1e8.data._M_elems[2] = local_2a8.data._M_elems[2];
          local_1e8.data._M_elems[3] = local_2a8.data._M_elems[3];
          local_1e8.exp = local_2a8.exp;
          local_1e8.neg = local_2a8.neg;
          local_1e8.fpclass = fVar8;
          pcVar4 = &local_2a8;
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1e8,&local_2a8);
          pcVar4 = &local_1e8;
          if (iVar6 < 1) {
            fVar8 = local_2a8.fpclass;
            goto LAB_002850f0;
          }
        }
        local_1e8.prec_elem = pcVar4->prec_elem;
      }
      if (local_268.fpclass == cpp_dec_float_NaN || local_e8.fpclass == cpp_dec_float_NaN) {
LAB_00285186:
        auVar5 = (undefined1  [16])local_268.data._M_elems._0_16_;
        local_e8.data._M_elems._32_5_ = local_268.data._M_elems._32_5_;
        local_e8.data._M_elems[9]._1_3_ = local_268.data._M_elems[9]._1_3_;
        local_e8.data._M_elems[4] = local_268.data._M_elems[4];
        local_e8.data._M_elems[5] = local_268.data._M_elems[5];
        local_e8.data._M_elems._24_5_ = local_268.data._M_elems._24_5_;
        local_e8.data._M_elems[7]._1_3_ = local_268.data._M_elems[7]._1_3_;
        local_e8.data._M_elems[0] = local_268.data._M_elems[0];
        local_e8.data._M_elems[1] = local_268.data._M_elems[1];
        local_e8.data._M_elems[2] = local_268.data._M_elems[2];
        local_e8.data._M_elems[3] = local_268.data._M_elems[3];
        local_e8.exp = local_268.exp;
        local_e8.neg = local_268.neg;
        local_e8.fpclass = local_268.fpclass;
        pcVar4 = &local_268;
        fVar8 = local_268.fpclass;
        local_268.data._M_elems._0_16_ = auVar5;
      }
      else {
        iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_e8,&local_268);
        pcVar4 = &local_e8;
        fVar8 = local_268.fpclass;
        if (-1 < iVar6) goto LAB_00285186;
      }
      local_e8.prec_elem = pcVar4->prec_elem;
      if ((local_128.fpclass == cpp_dec_float_NaN) || (fVar8 == cpp_dec_float_NaN)) {
LAB_00285221:
        auVar5 = (undefined1  [16])local_268.data._M_elems._0_16_;
        local_128.data._M_elems._32_5_ = local_268.data._M_elems._32_5_;
        local_128.data._M_elems[9]._1_3_ = local_268.data._M_elems[9]._1_3_;
        local_128.data._M_elems[4] = local_268.data._M_elems[4];
        local_128.data._M_elems[5] = local_268.data._M_elems[5];
        local_128.data._M_elems._24_5_ = local_268.data._M_elems._24_5_;
        local_128.data._M_elems[7]._1_3_ = local_268.data._M_elems[7]._1_3_;
        local_128.data._M_elems[0] = local_268.data._M_elems[0];
        local_128.data._M_elems[1] = local_268.data._M_elems[1];
        local_128.data._M_elems[2] = local_268.data._M_elems[2];
        local_128.data._M_elems[3] = local_268.data._M_elems[3];
        local_128.exp = local_268.exp;
        local_128.neg = local_268.neg;
        local_128.fpclass = fVar8;
        pcVar4 = &local_268;
        local_268.data._M_elems._0_16_ = auVar5;
      }
      else {
        iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_128,&local_268);
        pcVar4 = &local_128;
        if (iVar6 < 1) {
          fVar8 = local_268.fpclass;
          goto LAB_00285221;
        }
      }
      local_128.prec_elem = pcVar4->prec_elem;
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x38;
    } while (lVar9 < (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum);
  }
  if (0 < (this->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    lVar9 = 0x30;
    lVar10 = 0;
    do {
      pnVar3 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_2e8.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar9 + -8);
      local_2e8.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar9 + -4);
      local_2e8._48_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar9);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar9 + -0x30);
      local_2e8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_2e8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar9 + -0x20);
      local_2e8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_2e8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_2e8.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar9 + -0x10);
      if ((local_2e8.neg == true) &&
         (local_2e8.fpclass != cpp_dec_float_finite || local_2e8.data._M_elems[0] != 0)) {
        local_2e8.neg = false;
      }
      pnVar3 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_2a8.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar9 + -8);
      local_2a8.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar9 + -4);
      local_2a8._48_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar9);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar9 + -0x30);
      local_2a8.data._M_elems._0_8_ = *(undefined8 *)puVar2;
      local_2a8.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)((long)&(pnVar3->m_backend).data + lVar9 + -0x20);
      local_2a8.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_2a8.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      local_2a8.data._M_elems._32_8_ =
           *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar9 + -0x10);
      if ((local_2a8.neg == true) &&
         (local_2a8.fpclass != cpp_dec_float_finite || local_2a8.data._M_elems[0] != 0)) {
        local_2a8.neg = false;
      }
      ::soplex::infinity::__tls_init();
      local_268.fpclass = cpp_dec_float_finite;
      local_268.prec_elem = 10;
      local_268.data._M_elems[0] = 0;
      local_268.data._M_elems[1] = 0;
      local_268.data._M_elems[2] = 0;
      local_268.data._M_elems[3] = 0;
      local_268.data._M_elems[4] = 0;
      local_268.data._M_elems[5] = 0;
      local_268.data._M_elems._24_5_ = 0;
      local_268.data._M_elems[7]._1_3_ = 0;
      local_268.data._M_elems._32_5_ = 0;
      local_268.data._M_elems[9]._1_3_ = 0;
      local_268.exp = 0;
      local_268.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_268,local_270);
      if (((local_2e8.fpclass != cpp_dec_float_NaN) && (local_268.fpclass != cpp_dec_float_NaN)) &&
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_2e8,&local_268), 0 < iVar6)) {
        if (local_2e8.fpclass == cpp_dec_float_NaN || local_1a8.fpclass == cpp_dec_float_NaN) {
LAB_00285417:
          local_1a8.data._M_elems._32_5_ = local_2e8.data._M_elems._32_5_;
          local_1a8.data._M_elems[9]._1_3_ = local_2e8.data._M_elems[9]._1_3_;
          local_1a8.data._M_elems[4] = local_2e8.data._M_elems[4];
          local_1a8.data._M_elems[5] = local_2e8.data._M_elems[5];
          local_1a8.data._M_elems._24_5_ = local_2e8.data._M_elems._24_5_;
          local_1a8.data._M_elems[7]._1_3_ = local_2e8.data._M_elems[7]._1_3_;
          local_1a8.data._M_elems[0] = local_2e8.data._M_elems[0];
          local_1a8.data._M_elems[1] = local_2e8.data._M_elems[1];
          local_1a8.data._M_elems[2] = local_2e8.data._M_elems[2];
          local_1a8.data._M_elems[3] = local_2e8.data._M_elems[3];
          local_1a8.exp = local_2e8.exp;
          local_1a8.neg = local_2e8.neg;
          local_1a8.fpclass = local_2e8.fpclass;
          pcVar4 = &local_2e8;
          fVar8 = local_2e8.fpclass;
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1a8,&local_2e8);
          pcVar4 = &local_1a8;
          fVar8 = local_2e8.fpclass;
          if (-1 < iVar6) goto LAB_00285417;
        }
        local_1a8.prec_elem = pcVar4->prec_elem;
        if ((local_228.fpclass == cpp_dec_float_NaN) || (fVar8 == cpp_dec_float_NaN)) {
LAB_00285497:
          local_228.data._M_elems._32_5_ = local_2e8.data._M_elems._32_5_;
          local_228.data._M_elems[9]._1_3_ = local_2e8.data._M_elems[9]._1_3_;
          local_228.data._M_elems[4] = local_2e8.data._M_elems[4];
          local_228.data._M_elems[5] = local_2e8.data._M_elems[5];
          local_228.data._M_elems._24_5_ = local_2e8.data._M_elems._24_5_;
          local_228.data._M_elems[7]._1_3_ = local_2e8.data._M_elems[7]._1_3_;
          local_228.data._M_elems[0] = local_2e8.data._M_elems[0];
          local_228.data._M_elems[1] = local_2e8.data._M_elems[1];
          local_228.data._M_elems[2] = local_2e8.data._M_elems[2];
          local_228.data._M_elems[3] = local_2e8.data._M_elems[3];
          local_228.exp = local_2e8.exp;
          local_228.neg = local_2e8.neg;
          local_228.fpclass = fVar8;
          pcVar4 = &local_2e8;
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_228,&local_2e8);
          pcVar4 = &local_228;
          if (iVar6 < 1) {
            fVar8 = local_2e8.fpclass;
            goto LAB_00285497;
          }
        }
        local_228.prec_elem = pcVar4->prec_elem;
      }
      ::soplex::infinity::__tls_init();
      local_268.fpclass = cpp_dec_float_finite;
      local_268.prec_elem = 10;
      local_268.data._M_elems._0_16_ = ZEXT816(0);
      local_268.data._M_elems[4] = 0;
      local_268.data._M_elems[5] = 0;
      local_268.data._M_elems._24_5_ = 0;
      local_268.data._M_elems[7]._1_3_ = 0;
      local_268.data._M_elems._32_5_ = 0;
      local_268.data._M_elems[9]._1_3_ = 0;
      local_268.exp = 0;
      local_268.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_268,local_270);
      if (((local_2a8.fpclass != cpp_dec_float_NaN) && (local_268.fpclass != cpp_dec_float_NaN)) &&
         (iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_2a8,&local_268), iVar6 < 0)) {
        if (local_2a8.fpclass == cpp_dec_float_NaN || local_1a8.fpclass == cpp_dec_float_NaN) {
LAB_0028558c:
          local_1a8.data._M_elems._32_5_ = local_2a8.data._M_elems._32_5_;
          local_1a8.data._M_elems[9]._1_3_ = local_2a8.data._M_elems[9]._1_3_;
          local_1a8.data._M_elems[4] = local_2a8.data._M_elems[4];
          local_1a8.data._M_elems[5] = local_2a8.data._M_elems[5];
          local_1a8.data._M_elems._24_5_ = local_2a8.data._M_elems._24_5_;
          local_1a8.data._M_elems[7]._1_3_ = local_2a8.data._M_elems[7]._1_3_;
          local_1a8.data._M_elems[0] = local_2a8.data._M_elems[0];
          local_1a8.data._M_elems[1] = local_2a8.data._M_elems[1];
          local_1a8.data._M_elems[2] = local_2a8.data._M_elems[2];
          local_1a8.data._M_elems[3] = local_2a8.data._M_elems[3];
          local_1a8.exp = local_2a8.exp;
          local_1a8.neg = local_2a8.neg;
          local_1a8.fpclass = local_2a8.fpclass;
          pcVar4 = &local_2a8;
          fVar8 = local_2a8.fpclass;
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_1a8,&local_2a8);
          pcVar4 = &local_1a8;
          fVar8 = local_2a8.fpclass;
          if (-1 < iVar6) goto LAB_0028558c;
        }
        local_1a8.prec_elem = pcVar4->prec_elem;
        if ((local_228.fpclass == cpp_dec_float_NaN) || (fVar8 == cpp_dec_float_NaN)) {
LAB_0028560f:
          local_228.data._M_elems._32_5_ = local_2a8.data._M_elems._32_5_;
          local_228.data._M_elems[9]._1_3_ = local_2a8.data._M_elems[9]._1_3_;
          local_228.data._M_elems[4] = local_2a8.data._M_elems[4];
          local_228.data._M_elems[5] = local_2a8.data._M_elems[5];
          local_228.data._M_elems._24_5_ = local_2a8.data._M_elems._24_5_;
          local_228.data._M_elems[7]._1_3_ = local_2a8.data._M_elems[7]._1_3_;
          local_228.data._M_elems[0] = local_2a8.data._M_elems[0];
          local_228.data._M_elems[1] = local_2a8.data._M_elems[1];
          local_228.data._M_elems[2] = local_2a8.data._M_elems[2];
          local_228.data._M_elems[3] = local_2a8.data._M_elems[3];
          local_228.exp = local_2a8.exp;
          local_228.neg = local_2a8.neg;
          local_228.fpclass = fVar8;
          pcVar4 = &local_2a8;
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_228,&local_2a8);
          pcVar4 = &local_228;
          if (iVar6 < 1) {
            fVar8 = local_2a8.fpclass;
            goto LAB_0028560f;
          }
        }
        local_228.prec_elem = pcVar4->prec_elem;
      }
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 0x38;
    } while (lVar10 < (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum);
  }
  local_2e8.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
  local_2e8.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
  local_2e8.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
  local_2e8.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
  local_2e8.data._M_elems[4] = local_1e8.data._M_elems[4];
  local_2e8.data._M_elems[5] = local_1e8.data._M_elems[5];
  local_2e8.data._M_elems[0] = local_1e8.data._M_elems[0];
  local_2e8.data._M_elems[1] = local_1e8.data._M_elems[1];
  local_2e8.data._M_elems[2] = local_1e8.data._M_elems[2];
  local_2e8.data._M_elems[3] = local_1e8.data._M_elems[3];
  local_2e8.exp = local_1e8.exp;
  local_2e8.neg = local_1e8.neg;
  local_2e8.fpclass = local_1e8.fpclass;
  local_2e8.prec_elem = local_1e8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_2e8,&local_168);
  *(undefined8 *)(this->boundrange).m_backend.data._M_elems = local_2e8.data._M_elems._0_8_;
  *(undefined8 *)((this->boundrange).m_backend.data._M_elems + 2) = local_2e8.data._M_elems._8_8_;
  *(undefined8 *)((this->boundrange).m_backend.data._M_elems + 4) = local_2e8.data._M_elems._16_8_;
  *(undefined8 *)((this->boundrange).m_backend.data._M_elems + 6) = local_2e8.data._M_elems._24_8_;
  *(undefined8 *)((this->boundrange).m_backend.data._M_elems + 8) = local_2e8.data._M_elems._32_8_;
  (this->boundrange).m_backend.exp = local_2e8.exp;
  (this->boundrange).m_backend.neg = local_2e8.neg;
  (this->boundrange).m_backend.fpclass = local_2e8.fpclass;
  (this->boundrange).m_backend.prec_elem = local_2e8.prec_elem;
  local_2e8.data._M_elems[9]._1_3_ = local_228.data._M_elems[9]._1_3_;
  local_2e8.data._M_elems._32_5_ = local_228.data._M_elems._32_5_;
  local_2e8.data._M_elems[7]._1_3_ = local_228.data._M_elems[7]._1_3_;
  local_2e8.data._M_elems._24_5_ = local_228.data._M_elems._24_5_;
  local_2e8.data._M_elems[4] = local_228.data._M_elems[4];
  local_2e8.data._M_elems[5] = local_228.data._M_elems[5];
  local_2e8.data._M_elems[0] = local_228.data._M_elems[0];
  local_2e8.data._M_elems[1] = local_228.data._M_elems[1];
  local_2e8.data._M_elems[2] = local_228.data._M_elems[2];
  local_2e8.data._M_elems[3] = local_228.data._M_elems[3];
  local_2e8.exp = local_228.exp;
  local_2e8.neg = local_228.neg;
  local_2e8.fpclass = local_228.fpclass;
  local_2e8.prec_elem = local_228.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_2e8,&local_1a8);
  *(undefined8 *)(this->siderange).m_backend.data._M_elems = local_2e8.data._M_elems._0_8_;
  *(undefined8 *)((this->siderange).m_backend.data._M_elems + 2) = local_2e8.data._M_elems._8_8_;
  *(undefined8 *)((this->siderange).m_backend.data._M_elems + 4) = local_2e8.data._M_elems._16_8_;
  *(undefined8 *)((this->siderange).m_backend.data._M_elems + 6) = local_2e8.data._M_elems._24_8_;
  *(undefined8 *)((this->siderange).m_backend.data._M_elems + 8) = local_2e8.data._M_elems._32_8_;
  (this->siderange).m_backend.exp = local_2e8.exp;
  (this->siderange).m_backend.neg = local_2e8.neg;
  (this->siderange).m_backend.fpclass = local_2e8.fpclass;
  (this->siderange).m_backend.prec_elem = local_2e8.prec_elem;
  local_2e8.data._M_elems[9]._1_3_ = local_128.data._M_elems[9]._1_3_;
  local_2e8.data._M_elems._32_5_ = local_128.data._M_elems._32_5_;
  local_2e8.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
  local_2e8.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
  local_2e8.data._M_elems[4] = local_128.data._M_elems[4];
  local_2e8.data._M_elems[5] = local_128.data._M_elems[5];
  local_2e8.data._M_elems[0] = local_128.data._M_elems[0];
  local_2e8.data._M_elems[1] = local_128.data._M_elems[1];
  local_2e8.data._M_elems[2] = local_128.data._M_elems[2];
  local_2e8.data._M_elems[3] = local_128.data._M_elems[3];
  local_2e8.exp = local_128.exp;
  local_2e8.neg = local_128.neg;
  local_2e8.fpclass = local_128.fpclass;
  local_2e8.prec_elem = local_128.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_2e8,&local_e8);
  *(undefined8 *)(this->objrange).m_backend.data._M_elems = local_2e8.data._M_elems._0_8_;
  *(undefined8 *)((this->objrange).m_backend.data._M_elems + 2) = local_2e8.data._M_elems._8_8_;
  *(undefined8 *)((this->objrange).m_backend.data._M_elems + 4) = local_2e8.data._M_elems._16_8_;
  *(undefined8 *)((this->objrange).m_backend.data._M_elems + 6) = local_2e8.data._M_elems._24_8_;
  *(undefined8 *)((this->objrange).m_backend.data._M_elems + 8) = local_2e8.data._M_elems._32_8_;
  (this->objrange).m_backend.exp = local_2e8.exp;
  (this->objrange).m_backend.neg = local_2e8.neg;
  (this->objrange).m_backend.fpclass = local_2e8.fpclass;
  (this->objrange).m_backend.prec_elem = local_2e8.prec_elem;
  return;
}

Assistant:

void SPxSolverBase<R>::calculateProblemRanges()
{
   // only collect absolute values
   R minobj = R(infinity);
   R maxobj = 0.0;
   R minbound = R(infinity);
   R maxbound = 0.0;
   R minside = R(infinity);
   R maxside = 0.0;

   // get min and max absolute values of bounds and objective
   for(int j = 0; j < this->nCols(); ++j)
   {
      R abslow = spxAbs(this->lower(j));
      R absupp = spxAbs(this->lower(j));
      R absobj = spxAbs(this->obj(j));

      if(abslow < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, abslow);
         maxbound = SOPLEX_MAX(maxbound, abslow);
      }

      if(absupp < R(infinity))
      {
         minbound = SOPLEX_MIN(minbound, absupp);
         maxbound = SOPLEX_MAX(maxbound, absupp);
      }

      minobj = SOPLEX_MIN(minobj, absobj);
      maxobj = SOPLEX_MAX(maxobj, absobj);
   }

   // get min and max absoute values of sides
   for(int i = 0; i < this->nRows(); ++i)
   {
      R abslhs = spxAbs(this->lhs(i));
      R absrhs = spxAbs(this->rhs(i));

      if(abslhs > R(infinity))
      {
         minside = SOPLEX_MIN(minside, abslhs);
         maxside = SOPLEX_MAX(maxside, abslhs);
      }

      if(absrhs < R(infinity))
      {
         minside = SOPLEX_MIN(minside, absrhs);
         maxside = SOPLEX_MAX(maxside, absrhs);
      }
   }

   boundrange = maxbound - minbound;
   siderange = maxside - minside;
   objrange = maxobj - minobj;
}